

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O3

loader_impl loader_impl_create_host(char *tag)

{
  loader_impl plVar1;
  
  plVar1 = loader_impl_allocate(tag);
  if (plVar1 != (loader_impl)0x0) {
    plVar1->init = 0;
    plVar1->options = (value)0x0;
  }
  return plVar1;
}

Assistant:

loader_impl loader_impl_create_host(const loader_tag tag)
{
	loader_impl impl = loader_impl_allocate(tag);

	if (impl == NULL)
	{
		return NULL;
	}

	impl->init = 0; /* Do not call singleton initialize */
	impl->options = NULL;

	return impl;
}